

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

int INT_EVclient_force_shutdown(EVclient client,int result)

{
  CManager cm;
  FILE *pFVar1;
  int iVar2;
  __pid_t _Var3;
  CMFormat format;
  pthread_t pVar4;
  timespec ts;
  
  if (client->already_shutdown != 0) {
    printf("Node %d, already contributed to shutdown.  Don\'t call shutdown twice!\n",
           (ulong)(uint)client->my_node_id);
  }
  iVar2 = CMtrace_val[0xd];
  if (client->cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(client->cm,EVdfgVerbose);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      pFVar1 = (FILE *)client->cm->CMTrace_file;
      _Var3 = getpid();
      pVar4 = pthread_self();
      fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)client->cm->CMTrace_file,"%lld.%.9ld - ",
              CONCAT44(ts.tv_sec._4_4_,(uint)ts.tv_sec),ts.tv_nsec);
    }
    fprintf((FILE *)client->cm->CMTrace_file,"Client %d calling client_FORCE_shutdown\n",
            (ulong)(uint)client->my_node_id);
  }
  fflush((FILE *)client->cm->CMTrace_file);
  if (client->master_connection == (CMConnection)0x0) {
    possibly_signal_shutdown(client->master,result | 0x10000U,(CMConnection)0x0);
  }
  else {
    format = INT_CMlookup_format(client->cm,EVclient_shutdown_contribution_format_list);
    ts.tv_sec._0_4_ = result | 0x10000U;
    INT_CMwrite(client->master_connection,format,&ts);
  }
  if (client->already_shutdown == 0) {
    IntCManager_unlock(client->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                       ,0x711);
    iVar2 = CMtrace_val[0xd];
    if (client->cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(client->cm,EVdfgVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)client->cm->CMTrace_file;
        _Var3 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)client->cm->CMTrace_file,"%lld.%.9ld - ",
                CONCAT44(ts.tv_sec._4_4_,(uint)ts.tv_sec),ts.tv_nsec);
      }
      fprintf((FILE *)client->cm->CMTrace_file,"Client %d shutdown condition wait\n",
              (ulong)(uint)client->my_node_id);
    }
    fflush((FILE *)client->cm->CMTrace_file);
    cm = client->cm;
    iVar2 = new_shutdown_condition(client,client->master_connection);
    CMCondition_wait(cm,iVar2);
    iVar2 = CMtrace_val[0xd];
    if (client->cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(client->cm,EVdfgVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)client->cm->CMTrace_file;
        _Var3 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)client->cm->CMTrace_file,"%lld.%.9ld - ",
                CONCAT44(ts.tv_sec._4_4_,(uint)ts.tv_sec),ts.tv_nsec);
      }
      fprintf((FILE *)client->cm->CMTrace_file,"Client %d shutdown condition wait DONE!\n",
              (ulong)(uint)client->my_node_id);
    }
    fflush((FILE *)client->cm->CMTrace_file);
    IntCManager_lock(client->cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,0x715);
  }
  return client->shutdown_value;
}

Assistant:

extern int
INT_EVclient_force_shutdown(EVclient client, int result)
{
    result |= STATUS_FORCE;
    if (client->already_shutdown) printf("Node %d, already contributed to shutdown.  Don't call shutdown twice!\n", client->my_node_id);
    CMtrace_out(client->cm, EVdfgVerbose, "Client %d calling client_FORCE_shutdown\n", client->my_node_id);
    if (client->master_connection != NULL) {
	/* we are a client, tell the master to shutdown */
	CMFormat shutdown_msg = INT_CMlookup_format(client->cm, EVclient_shutdown_contribution_format_list);
	EVshutdown_contribution_msg msg;
	msg.value = result;
	INT_CMwrite(client->master_connection, shutdown_msg, &msg);
	/* and wait until we hear back */
    } else {
	possibly_signal_shutdown(client->master, result, NULL);
    }
    if (!client->already_shutdown) {
	CManager_unlock(client->cm);
	CMtrace_out(client->cm, EVdfgVerbose, "Client %d shutdown condition wait\n", client->my_node_id);
	CMCondition_wait(client->cm, new_shutdown_condition(client, client->master_connection));
	CMtrace_out(client->cm, EVdfgVerbose, "Client %d shutdown condition wait DONE!\n", client->my_node_id);
	CManager_lock(client->cm);
    }
    return client->shutdown_value;
}